

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O3

void ay8910_update_one(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  __s = *outputs;
  pDVar4 = outputs[1];
  __n = (ulong)samples * 4;
  memset(__s,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0 && *(char *)((long)param + 0x2ce) == '\0') {
    uVar11 = 0;
    do {
      lVar7 = -3;
      do {
        iVar8 = *(int *)((long)param + lVar7 * 4 + 0x30) + 1;
        *(int *)((long)param + lVar7 * 4 + 0x30) = iVar8;
        if ((int)((*(byte *)((long)param + lVar7 * 2 + 0x17) & 0xf) << 8 |
                 (uint)*(byte *)((long)param + lVar7 * 2 + 0x16)) <= iVar8) {
          pbVar1 = (byte *)((long)param + lVar7 + 0x33);
          *pbVar1 = *pbVar1 ^ 1;
          *(undefined4 *)((long)param + lVar7 * 4 + 0x30) = 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      iVar8 = *(int *)((long)param + 0x34) + 1;
      *(int *)((long)param + 0x34) = iVar8;
      if (iVar8 < (int)(*(byte *)((long)param + 0x16) & 0x1f)) {
        uVar6 = *(uint *)((long)param + 0x48);
      }
      else {
        *(undefined4 *)((long)param + 0x34) = 0;
        bVar5 = *(byte *)((long)param + 0x33);
        *(byte *)((long)param + 0x33) = bVar5 ^ 1;
        uVar6 = *(uint *)((long)param + 0x48);
        if (bVar5 != 1) {
          uVar6 = (int)(((uVar6 >> 3 ^ uVar6) & 1) << 0x11 ^ uVar6) >> 1;
          *(uint *)((long)param + 0x48) = uVar6;
        }
      }
      bVar5 = *(byte *)((long)param + 0x17);
      lVar7 = 0;
      do {
        *(byte *)((long)param + lVar7 + 0x55) =
             (bVar5 >> ((byte)lVar7 + 3 & 0x1f) | (byte)uVar6) &
             (bVar5 >> ((byte)lVar7 & 0x1f) | *(byte *)((long)param + lVar7 + 0x30)) & 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if (*(char *)((long)param + 0x47) == '\0') {
        iVar8 = *(int *)((long)param + 0x38) + 1;
        *(int *)((long)param + 0x38) = iVar8;
        bVar5 = *(byte *)((long)param + 0x3c);
        if ((int)((uint)*(ushort *)((long)param + 0x1b) * *(int *)((long)param + 0x50)) <= iVar8) {
          *(undefined4 *)((long)param + 0x38) = 0;
          bVar5 = bVar5 - 1;
          *(byte *)((long)param + 0x3c) = bVar5;
          if ((char)bVar5 < '\0') {
            if (*(char *)((long)param + 0x44) == '\0') {
              bVar2 = *(byte *)((long)param + 0x4c);
              if ((*(char *)((long)param + 0x45) != '\0') && ((bVar2 + 1 & (int)(char)bVar5) != 0))
              {
                *(byte *)((long)param + 0x46) = *(byte *)((long)param + 0x46) ^ bVar2;
              }
              bVar5 = bVar2 & bVar5;
              *(byte *)((long)param + 0x3c) = bVar5;
            }
            else {
              if (*(char *)((long)param + 0x45) != '\0') {
                *(byte *)((long)param + 0x46) =
                     *(byte *)((long)param + 0x46) ^ *(byte *)((long)param + 0x4c);
              }
              *(undefined1 *)((long)param + 0x47) = 1;
              *(undefined1 *)((long)param + 0x3c) = 0;
              bVar5 = 0;
            }
          }
        }
      }
      else {
        bVar5 = *(byte *)((long)param + 0x3c);
      }
      *(uint *)((long)param + 0x40) = (uint)*(byte *)((long)param + 0x46) ^ (int)(char)bVar5;
      lVar7 = 0x2b8;
      lVar12 = 0x68;
      lVar13 = 0;
      do {
        if (*(int *)((long)param + lVar7 * 4 + -0x824) != 0) {
          bVar5 = *(byte *)((long)param + lVar7 + -0x2a0);
          bVar2 = bVar5 >> 4;
          cVar3 = *(char *)((long)param + lVar7 + -0x263);
          if (((*(char *)((long)param + 0x2cc) == '\x04') * '\x02' + 1U & bVar2) == 0) {
            uVar6 = bVar5 & 0xf;
            if (cVar3 == '\0') {
              uVar6 = 0;
            }
            piVar9 = (int *)(lVar12 + (ulong)uVar6 * 4 + (long)param);
          }
          else if (*(char *)((long)param + 0x2cc) == '\x04') {
            if (cVar3 == '\0') {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)(*(uint *)((long)param + 0x40) >> (~bVar2 & 3));
            }
            piVar9 = (int *)((long)param + uVar10 * 4 + lVar13 * 0x80 + 0x128);
          }
          else {
            if (cVar3 == '\0') {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)*(uint *)((long)param + 0x40);
            }
            piVar9 = (int *)((long)param + uVar10 * 4 + lVar13 * 0x80 + 0x128);
          }
          iVar8 = *piVar9;
          bVar5 = *(byte *)((long)param + lVar7);
          if ((bVar5 & 1) != 0) {
            piVar9 = __s + uVar11;
            *piVar9 = *piVar9 + iVar8;
            bVar5 = *(byte *)((long)param + lVar7);
          }
          if ((bVar5 & 2) != 0) {
            pDVar4[uVar11] = pDVar4[uVar11] + iVar8;
          }
        }
        lVar13 = lVar13 + 1;
        lVar7 = lVar7 + 1;
        lVar12 = lVar12 + 0x40;
      } while (lVar12 != 0x128);
      uVar11 = uVar11 + 1;
    } while (uVar11 != samples);
  }
  return;
}

Assistant:

void ay8910_update_one(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ay8910_context *psg = (ay8910_context *)param;
	int chan;
	UINT32 cur_smpl;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	DEV_SMPL chnout;
	
	memset(outputs[0], 0x00, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0x00, samples * sizeof(DEV_SMPL));
	
	// Speed hack for OPN chips (YM2203, YM26xx), that have an often unused AY8910
	if (psg->IsDisabled)
		return;
	
	/* The 8910 has three outputs, each output is the mix of one of the three */
	/* tone generators and of the (single) noise generator. The two are mixed */
	/* BEFORE going into the DAC. The formula to mix each channel is: */
	/* (ToneOn | ToneDisable) & (NoiseOn | NoiseDisable). */
	/* Note that this means that if both tone and noise are disabled, the output */
	/* is 1, not 0, and can be modulated changing the volume. */

	/* buffering loop */
	for (cur_smpl = 0; cur_smpl < samples; cur_smpl++)
	{
		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->count[chan]++;
			if (psg->count[chan] >= TONE_PERIOD(psg, chan))
			{
				psg->output[chan] ^= 1;
				psg->count[chan] = 0;
			}
		}

		psg->count_noise++;
		if (psg->count_noise >= NOISE_PERIOD(psg))
		{
			/* toggle the prescaler output. Noise is no different to
			 * channels.
			 */
			psg->count_noise = 0;
			psg->prescale_noise ^= 1;

			if ( psg->prescale_noise)
			{
				/* The Random Number Generator of the 8910 is a 17-bit shift */
				/* register. The input to the shift register is bit0 XOR bit3 */
				/* (bit0 is the output). This was verified on AY-3-8910 and YM2149 chips. */

				psg->rng ^= (((psg->rng & 1) ^ ((psg->rng >> 3) & 1)) << 17);
				psg->rng >>= 1;
			}
		}

		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->vol_enabled[chan] = (psg->output[chan] | TONE_ENABLEQ(psg, chan)) & (NOISE_OUTPUT(psg) | NOISE_ENABLEQ(psg, chan));
		}

		/* update envelope */
		if (psg->holding == 0)
		{
			psg->count_env++;
			if (psg->count_env >= ENVELOPE_PERIOD(psg) * psg->step )
			{
				psg->count_env = 0;
				psg->env_step--;

				/* check envelope current position */
				if (psg->env_step < 0)
				{
					if (psg->hold)
					{
						if (psg->alternate)
							psg->attack ^= psg->env_step_mask;
						psg->holding = 1;
						psg->env_step = 0;
					}
					else
					{
						/* if CountEnv has looped an odd number of times (usually 1), */
						/* invert the output. */
						if (psg->alternate && (psg->env_step & (psg->env_step_mask + 1)))
 							psg->attack ^= psg->env_step_mask;

						psg->env_step &= psg->env_step_mask;
					}
				}

			}
		}
		psg->env_volume = (psg->env_step ^ psg->attack);

#if ENABLE_CUSTOM_OUTPUTS
		if (psg->streams == 3)
#endif
		{
			for (chan = 0; chan < NUM_CHANNELS; chan++)
			{
				if (! psg->MuteMsk[chan])
					continue;
				if (TONE_ENVELOPE(psg, chan) != 0)
				{
					if (psg->chip_type == AYTYPE_AY8914) // AY8914 Has a two bit tone_envelope field
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume >> (3-TONE_ENVELOPE(psg,chan)) : 0];
					}
					else
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume : 0];
					}
				}
				else
				{
					chnout = psg->vol_table[chan][psg->vol_enabled[chan] ? TONE_VOLUME(psg, chan) : 0];
				}
				if (psg->StereoMask[chan] & 0x01)
					bufL[cur_smpl] += chnout;
				if (psg->StereoMask[chan] & 0x02)
					bufR[cur_smpl] += chnout;
			}
		}
#if ENABLE_CUSTOM_OUTPUTS
		else
		{
			chnout = mix_3D(psg);
			bufL[cur_smpl] += chnout;
			bufR[cur_smpl] += chnout;
		}
#endif
	}
}